

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_16x4_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  code *pcVar5;
  code *pcVar6;
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  bool bVar21;
  int8_t *piVar22;
  undefined7 in_register_00000009;
  ulong *puVar23;
  int iVar24;
  int16_t *piVar25;
  ulong *puVar26;
  long lVar27;
  int16_t *topL;
  undefined8 *puVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 local_138 [4];
  int iStack_134;
  undefined8 uStack_130;
  int local_128 [17];
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  undefined1 local_c8 [16];
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  undefined1 local_88 [16];
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  piVar22 = av1_fwd_txfm_shift_ls[0xe];
  uVar7 = (uint)CONCAT71(in_register_00000009,tx_type);
  pcVar5 = *(code **)((long)col_highbd_txfm4x4_arr + (ulong)(uVar7 * 8));
  pcVar6 = *(code **)((long)row_highbd_txfm8x16_arr + (ulong)(uVar7 * 8));
  if (uVar7 < 0x10) {
    if ((0x4110U >> (uVar7 & 0x1f) & 1) == 0) {
      iVar24 = 0;
      if ((0x80a0U >> (uVar7 & 0x1f) & 1) == 0) {
        if (uVar7 != 6) goto LAB_00427389;
        iVar24 = 1;
      }
      cVar4 = *av1_fwd_txfm_shift_ls[0xe];
      load_buffer_8x4(input + 8,(__m128i *)local_138,stride,iVar24,1,(int)cVar4);
      load_buffer_8x4(input,(__m128i *)&local_b8,stride,iVar24,1,(int)cVar4);
      goto LAB_004275af;
    }
    uVar1 = *(ulong *)(input + stride * 3);
    uVar2 = *(ulong *)(input + stride * 2);
    uVar3 = *(ulong *)(input + stride);
    bVar21 = false;
    piVar25 = input;
  }
  else {
LAB_00427389:
    uVar1 = *(ulong *)input;
    uVar2 = *(ulong *)(input + stride);
    uVar3 = *(ulong *)(input + stride * 2);
    bVar21 = true;
    piVar25 = input + stride * 3;
  }
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar3;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar2;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar1;
  local_48 = (int)*av1_fwd_txfm_shift_ls[0xe];
  puVar23 = (ulong *)(input + 4);
  auVar35 = pmovsxwd(in_XMM3,*(undefined8 *)piVar25);
  auVar39 = pmovsxwd(in_XMM4,auVar40);
  auVar40 = pmovsxwd(auVar29,auVar29);
  local_138 = (undefined1  [4])(auVar39._0_4_ << local_48);
  iStack_134 = auVar39._4_4_;
  uStack_130._0_4_ = auVar39._8_4_;
  uStack_130._4_4_ = auVar39._12_4_;
  auVar29 = pmovsxwd(auVar32,auVar32);
  local_128[0] = auVar40._0_4_ << local_48;
  local_128[1] = auVar40._4_4_;
  local_128[2] = auVar40._8_4_;
  local_128[3] = auVar40._12_4_;
  local_128[4] = auVar29._0_4_ << local_48;
  local_128[5] = auVar29._4_4_;
  local_128[6] = auVar29._8_4_;
  local_128[7] = auVar29._12_4_;
  local_128[8] = auVar35._0_4_ << local_48;
  local_128[9] = auVar35._4_4_;
  local_128[10] = auVar35._8_4_;
  local_128[0xb] = auVar35._12_4_;
  if (bVar21) {
    uVar1 = *puVar23;
    uVar2 = *(ulong *)((long)puVar23 + (long)stride * 2);
    uVar3 = *(ulong *)((long)puVar23 + (long)(stride * 2) * 2);
    puVar23 = (ulong *)((long)puVar23 + (long)(stride * 3) * 2);
  }
  else {
    uVar1 = *(ulong *)((long)puVar23 + (long)(stride * 3) * 2);
    uVar2 = *(ulong *)((long)puVar23 + (long)(stride * 2) * 2);
    uVar3 = *(ulong *)((long)puVar23 + (long)stride * 2);
  }
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar3;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar2;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar1;
  puVar26 = (ulong *)(input + 8);
  auVar32 = pmovsxwd((undefined1  [16])_local_138,*puVar23);
  auVar29 = pmovsxwd(auVar36,auVar36);
  auVar40 = pmovsxwd(auVar35,auVar35);
  local_128[0xc] = auVar40._0_4_ << local_48;
  local_128[0xd] = auVar40._4_4_;
  local_128[0xe] = auVar40._8_4_;
  local_128[0xf] = auVar40._12_4_;
  auVar40 = pmovsxwd(auVar39,auVar39);
  local_128[0x10] = auVar40._0_4_ << local_48;
  iStack_e4 = auVar40._4_4_;
  iStack_e0 = auVar40._8_4_;
  iStack_dc = auVar40._12_4_;
  local_d8 = auVar29._0_4_ << local_48;
  iStack_d4 = auVar29._4_4_;
  iStack_d0 = auVar29._8_4_;
  iStack_cc = auVar29._12_4_;
  local_c8._0_4_ = auVar32._0_4_ << local_48;
  local_c8._4_4_ = auVar32._4_4_;
  local_c8._8_4_ = auVar32._8_4_;
  local_c8._12_4_ = auVar32._12_4_;
  if (bVar21) {
    uVar1 = *puVar26;
    uVar2 = *(ulong *)((long)puVar26 + (long)stride * 2);
    uVar3 = *(ulong *)((long)puVar26 + (long)(stride * 2) * 2);
    puVar26 = (ulong *)((long)puVar26 + (long)(stride * 3) * 2);
  }
  else {
    uVar1 = *(ulong *)((long)puVar26 + (long)(stride * 3) * 2);
    uVar2 = *(ulong *)((long)puVar26 + (long)(stride * 2) * 2);
    uVar3 = *(ulong *)((long)puVar26 + (long)stride * 2);
  }
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar3;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar2;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar1;
  puVar23 = (ulong *)(input + 0xc);
  auVar32 = pmovsxwd(local_c8,*puVar26);
  auVar40 = pmovsxwd(auVar30,auVar30);
  auVar29 = pmovsxwd(auVar33,auVar33);
  local_b8 = auVar40._0_4_ << local_48;
  iStack_b4 = auVar40._4_4_;
  iStack_b0 = auVar40._8_4_;
  iStack_ac = auVar40._12_4_;
  auVar40 = pmovsxwd(auVar37,auVar37);
  local_a8 = auVar29._0_4_ << local_48;
  iStack_a4 = auVar29._4_4_;
  iStack_a0 = auVar29._8_4_;
  iStack_9c = auVar29._12_4_;
  local_98 = auVar40._0_4_ << local_48;
  iStack_94 = auVar40._4_4_;
  iStack_90 = auVar40._8_4_;
  iStack_8c = auVar40._12_4_;
  local_88._0_4_ = auVar32._0_4_ << local_48;
  local_88._4_4_ = auVar32._4_4_;
  local_88._8_4_ = auVar32._8_4_;
  local_88._12_4_ = auVar32._12_4_;
  if (bVar21) {
    uVar1 = *puVar23;
    uVar2 = *(ulong *)((long)puVar23 + (long)stride * 2);
    uVar3 = *(ulong *)((long)puVar23 + (long)(stride * 2) * 2);
    puVar23 = (ulong *)((long)puVar23 + (long)(stride * 3) * 2);
  }
  else {
    uVar1 = *(ulong *)((long)puVar23 + (long)(stride * 3) * 2);
    uVar2 = *(ulong *)((long)puVar23 + (long)(stride * 2) * 2);
    uVar3 = *(ulong *)((long)puVar23 + (long)stride * 2);
  }
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar3;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar2;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar1;
  auVar35 = pmovsxwd(local_88,*puVar23);
  auVar32 = pmovsxwd(auVar38,auVar38);
  auVar29 = pmovsxwd(auVar34,auVar34);
  auVar40 = pmovsxwd(auVar31,auVar31);
  local_78 = auVar40._0_4_ << local_48;
  iStack_74 = auVar40._4_4_;
  iStack_70 = auVar40._8_4_;
  iStack_6c = auVar40._12_4_;
  local_68 = auVar29._0_4_ << local_48;
  iStack_64 = auVar29._4_4_;
  iStack_60 = auVar29._8_4_;
  iStack_5c = auVar29._12_4_;
  local_58 = auVar32._0_4_ << local_48;
  iStack_54 = auVar32._4_4_;
  iStack_50 = auVar32._8_4_;
  iStack_4c = auVar32._12_4_;
  local_48 = auVar35._0_4_ << local_48;
  iStack_44 = auVar35._4_4_;
  iStack_40 = auVar35._8_4_;
  iStack_3c = auVar35._12_4_;
LAB_004275af:
  lVar27 = 0;
  do {
    puVar28 = (undefined8 *)(local_138 + lVar27);
    (*pcVar5)(puVar28,puVar28,0xd,1);
    uVar15 = *(undefined4 *)(local_138 + lVar27 + 8);
    uVar16 = *(undefined4 *)(local_138 + lVar27 + 0xc);
    uVar8 = *(undefined4 *)((long)local_128 + lVar27 + 4);
    uVar9 = *(undefined4 *)((long)local_128 + lVar27 + 8);
    uVar10 = *(undefined4 *)((long)local_128 + lVar27 + 0xc);
    uVar17 = *(undefined4 *)((long)local_128 + lVar27 + 0x10);
    uVar18 = *(undefined4 *)((long)local_128 + lVar27 + 0x14);
    uVar19 = *(undefined4 *)((long)local_128 + lVar27 + 0x18);
    uVar20 = *(undefined4 *)((long)local_128 + lVar27 + 0x1c);
    uVar11 = *(undefined4 *)((long)local_128 + lVar27 + 0x20);
    uVar12 = *(undefined4 *)((long)local_128 + lVar27 + 0x24);
    uVar13 = *(undefined4 *)((long)local_128 + lVar27 + 0x28);
    uVar14 = *(undefined4 *)((long)local_128 + lVar27 + 0x2c);
    *puVar28 = CONCAT44(*(undefined4 *)((long)local_128 + lVar27),*(undefined4 *)puVar28);
    *(ulong *)(local_138 + lVar27 + 8) = CONCAT44(uVar11,uVar17);
    *(undefined4 *)((long)local_128 + lVar27 + 8) = *(undefined4 *)(local_138 + lVar27 + 4);
    *(undefined4 *)((long)local_128 + lVar27 + 0xc) = uVar8;
    *(undefined4 *)((long)local_128 + lVar27 + 0x10) = uVar18;
    *(undefined4 *)((long)local_128 + lVar27 + 0x14) = uVar12;
    *(undefined4 *)((long)local_128 + lVar27 + 0x10) = uVar15;
    *(undefined4 *)((long)local_128 + lVar27 + 0x14) = uVar9;
    *(undefined4 *)((long)local_128 + lVar27 + 0x18) = uVar19;
    *(undefined4 *)((long)local_128 + lVar27 + 0x1c) = uVar13;
    *(undefined4 *)((long)local_128 + lVar27 + 0x28) = uVar16;
    *(undefined4 *)((long)local_128 + lVar27 + 0x2c) = uVar10;
    *(undefined4 *)((long)local_128 + lVar27 + 0x30) = uVar20;
    *(undefined4 *)((long)local_128 + lVar27 + 0x34) = uVar14;
    lVar27 = lVar27 + 0x40;
  } while (lVar27 != 0x100);
  iVar24 = 1 << (~piVar22[1] & 0x1fU);
  auVar40 = ZEXT416((uint)-(int)piVar22[1]);
  local_128[0] = local_128[0] + iVar24 >> auVar40;
  local_128[1] = local_128[1] + iVar24 >> auVar40;
  local_128[2] = local_128[2] + iVar24 >> auVar40;
  local_128[3] = local_128[3] + iVar24 >> auVar40;
  iStack_134 = iStack_134 + iVar24 >> auVar40;
  local_138 = (undefined1  [4])((int)local_138 + iVar24 >> auVar40);
  uStack_130._0_4_ = (int)uStack_130 + iVar24 >> auVar40;
  uStack_130._4_4_ = uStack_130._4_4_ + iVar24 >> auVar40;
  local_128[4] = local_128[4] + iVar24 >> auVar40;
  local_128[5] = local_128[5] + iVar24 >> auVar40;
  local_128[6] = local_128[6] + iVar24 >> auVar40;
  local_128[7] = local_128[7] + iVar24 >> auVar40;
  local_128[8] = local_128[8] + iVar24 >> auVar40;
  local_128[9] = local_128[9] + iVar24 >> auVar40;
  local_128[10] = local_128[10] + iVar24 >> auVar40;
  local_128[0xb] = local_128[0xb] + iVar24 >> auVar40;
  local_128[0xc] = local_128[0xc] + iVar24 >> auVar40;
  local_128[0xd] = local_128[0xd] + iVar24 >> auVar40;
  local_128[0xe] = local_128[0xe] + iVar24 >> auVar40;
  local_128[0xf] = local_128[0xf] + iVar24 >> auVar40;
  local_128[0x10] = local_128[0x10] + iVar24 >> auVar40;
  iStack_e4 = iStack_e4 + iVar24 >> auVar40;
  iStack_e0 = iStack_e0 + iVar24 >> auVar40;
  iStack_dc = iStack_dc + iVar24 >> auVar40;
  local_d8 = local_d8 + iVar24 >> auVar40;
  iStack_d4 = iStack_d4 + iVar24 >> auVar40;
  iStack_d0 = iStack_d0 + iVar24 >> auVar40;
  iStack_cc = iStack_cc + iVar24 >> auVar40;
  local_c8._4_4_ = local_c8._4_4_ + iVar24 >> auVar40;
  local_c8._0_4_ = local_c8._0_4_ + iVar24 >> auVar40;
  local_c8._8_4_ = local_c8._8_4_ + iVar24 >> auVar40;
  local_c8._12_4_ = local_c8._12_4_ + iVar24 >> auVar40;
  local_b8 = local_b8 + iVar24 >> auVar40;
  iStack_b4 = iStack_b4 + iVar24 >> auVar40;
  iStack_b0 = iStack_b0 + iVar24 >> auVar40;
  iStack_ac = iStack_ac + iVar24 >> auVar40;
  local_a8 = local_a8 + iVar24 >> auVar40;
  iStack_a4 = iStack_a4 + iVar24 >> auVar40;
  iStack_a0 = iStack_a0 + iVar24 >> auVar40;
  iStack_9c = iStack_9c + iVar24 >> auVar40;
  local_98 = local_98 + iVar24 >> auVar40;
  iStack_94 = iStack_94 + iVar24 >> auVar40;
  iStack_90 = iStack_90 + iVar24 >> auVar40;
  iStack_8c = iStack_8c + iVar24 >> auVar40;
  local_88._4_4_ = local_88._4_4_ + iVar24 >> auVar40;
  local_88._0_4_ = local_88._0_4_ + iVar24 >> auVar40;
  local_88._8_4_ = local_88._8_4_ + iVar24 >> auVar40;
  local_88._12_4_ = local_88._12_4_ + iVar24 >> auVar40;
  local_78 = local_78 + iVar24 >> auVar40;
  iStack_74 = iStack_74 + iVar24 >> auVar40;
  iStack_70 = iStack_70 + iVar24 >> auVar40;
  iStack_6c = iStack_6c + iVar24 >> auVar40;
  local_68 = local_68 + iVar24 >> auVar40;
  iStack_64 = iStack_64 + iVar24 >> auVar40;
  iStack_60 = iStack_60 + iVar24 >> auVar40;
  iStack_5c = iStack_5c + iVar24 >> auVar40;
  local_58 = local_58 + iVar24 >> auVar40;
  iStack_54 = iStack_54 + iVar24 >> auVar40;
  iStack_50 = iStack_50 + iVar24 >> auVar40;
  iStack_4c = iStack_4c + iVar24 >> auVar40;
  local_48 = iVar24 + local_48 >> auVar40;
  iStack_44 = iVar24 + iStack_44 >> auVar40;
  iStack_40 = iVar24 + iStack_40 >> auVar40;
  iStack_3c = iVar24 + iStack_3c >> auVar40;
  (*pcVar6)(local_138,coeff,0xd,1);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x4_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[16];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X4];
  const int txw_idx = get_txw_idx(TX_16X4);
  const int txh_idx = get_txh_idx(TX_16X4);
  const int txfm_size_col = tx_size_wide[TX_16X4];
  const int txfm_size_row = tx_size_high[TX_16X4];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm4x4_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x16_arr[tx_type];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  // col transform
  load_buffer_16x4(input, in, stride, ud_flip, lr_flip, shift[0]);

  for (int i = 0; i < (txfm_size_col >> 2); i++) {
    __m128i *cur_in = &in[i * txfm_size_row];
    col_txfm(cur_in, cur_in, bitcol, 1);
    transpose_32bit_4x4(cur_in, cur_in);
  }
  col_txfm_8x8_rounding(in, -shift[1]);

  // row transform
  row_txfm(in, outcoeff128, bitrow, 1);
  (void)bd;
}